

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType0::GridDataType0(GridDataType0 *this,KDataStream *stream)

{
  KDataStream *stream_local;
  GridDataType0 *this_local;
  
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType0_004f2ad8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vui8DataVals);
  (*(this->super_GridData).super_DataTypeBase._vptr_DataTypeBase[3])(this,stream);
  return;
}

Assistant:

GridDataType0::GridDataType0(KDataStream &stream) noexcept(false)
{
    Decode( stream );
}